

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CollisionElasticPdu.cpp
# Opt level: O3

int __thiscall DIS::CollisionElasticPdu::getMarshalledSize(CollisionElasticPdu *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  
  iVar1 = EntityInformationFamilyPdu::getMarshalledSize(&this->super_EntityInformationFamilyPdu);
  iVar2 = EntityID::getMarshalledSize(&this->_issuingEntityID);
  iVar3 = EntityID::getMarshalledSize(&this->_collidingEntityID);
  iVar4 = EventIdentifier::getMarshalledSize(&this->_collisionEventID);
  iVar5 = Vector3Float::getMarshalledSize(&this->_contactVelocity);
  iVar6 = Vector3Float::getMarshalledSize(&this->_locationOfImpact);
  iVar7 = Vector3Float::getMarshalledSize(&this->_unitSurfaceNormal);
  return iVar7 + iVar6 + iVar5 + iVar4 + iVar3 + iVar2 + iVar1 + 0x22;
}

Assistant:

int CollisionElasticPdu::getMarshalledSize() const
{
   int marshalSize = 0;

   marshalSize = EntityInformationFamilyPdu::getMarshalledSize();
   marshalSize = marshalSize + _issuingEntityID.getMarshalledSize();  // _issuingEntityID
   marshalSize = marshalSize + _collidingEntityID.getMarshalledSize();  // _collidingEntityID
   marshalSize = marshalSize + _collisionEventID.getMarshalledSize();  // _collisionEventID
   marshalSize = marshalSize + 2;  // _pad
   marshalSize = marshalSize + _contactVelocity.getMarshalledSize();  // _contactVelocity
   marshalSize = marshalSize + 4;  // _mass
   marshalSize = marshalSize + _locationOfImpact.getMarshalledSize();  // _locationOfImpact
   marshalSize = marshalSize + 4;  // _collisionIntermediateResultXX
   marshalSize = marshalSize + 4;  // _collisionIntermediateResultXY
   marshalSize = marshalSize + 4;  // _collisionIntermediateResultXZ
   marshalSize = marshalSize + 4;  // _collisionIntermediateResultYY
   marshalSize = marshalSize + 4;  // _collisionIntermediateResultYZ
   marshalSize = marshalSize + 4;  // _collisionIntermediateResultZZ
   marshalSize = marshalSize + _unitSurfaceNormal.getMarshalledSize();  // _unitSurfaceNormal
   marshalSize = marshalSize + 4;  // _coefficientOfRestitution
    return marshalSize;
}